

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

int mcu8str_is_ascii(mcu8str *str)

{
  char *pcVar1;
  char *itE;
  char *it;
  mcu8str *str_local;
  
  it = str->c_str;
  pcVar1 = it + str->size;
  while( true ) {
    if (it == pcVar1) {
      return 1;
    }
    if (0x7f < (byte)*it) break;
    it = it + 1;
  }
  return 0;
}

Assistant:

int mcu8str_is_ascii( const mcu8str* str )
  {
    const char * it = str->c_str;
    const char * itE = it + str->size;
    for ( ; it!=itE; ++it )
      if ( (unsigned char)(*it) >= 128 )
        return 0;
    return 1;
  }